

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1067.cpp
# Opt level: O2

void __thiscall tree::tree(tree *this,string *name)

{
  _Rb_tree_header *p_Var1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->child)._M_t._M_impl.super__Rb_tree_header;
  (this->child)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->child)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->child)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->child)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->child)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)this);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>_>_>
  ::operator=(&this->child,
              (initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>_>
               )ZEXT816(0));
  return;
}

Assistant:

tree(std::string name) {
        this->name = name;
        this->child = {};
    }